

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_main.cpp
# Opt level: O0

void addterm(_func_void *func,char *name)

{
  long lVar1;
  int local_1c;
  int i;
  char *name_local;
  _func_void *func_local;
  
  local_1c = 0;
  while( true ) {
    if (NumTerms <= local_1c) {
      if (NumTerms == 0x40) {
        (*func)();
        I_FatalError("Too many exit functions registered.\nIncrease MAX_TERMS in i_main.cpp");
      }
      TermNames[NumTerms] = name;
      lVar1 = (long)NumTerms;
      NumTerms = NumTerms + 1;
      TermFuncs[lVar1] = func;
      return;
    }
    if (TermFuncs[local_1c] == func) break;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void addterm (void (*func) (), const char *name)
{
	// Make sure this function wasn't already registered.
	for (int i = 0; i < NumTerms; ++i)
	{
		if (TermFuncs[i] == func)
		{
			return;
		}
	}
    if (NumTerms == MAX_TERMS)
	{
		func ();
		I_FatalError (
			"Too many exit functions registered.\n"
			"Increase MAX_TERMS in i_main.cpp");
	}
	TermNames[NumTerms] = name;
    TermFuncs[NumTerms++] = func;
}